

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.h
# Opt level: O1

bool winmd::reader::filter::match
               (string_view *type_namespace,string_view *type_name,string_view *match)

{
  ulong __n1;
  int iVar1;
  size_type __n1_00;
  ulong uVar2;
  bool bVar3;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  
  uVar2 = match->_M_len;
  __n1 = type_namespace->_M_len;
  if (__n1 < uVar2) {
    __str._M_str = type_namespace->_M_str;
    __str._M_len = __n1;
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(match,0,__n1,__str);
    if (iVar1 == 0) {
      if (match->_M_str[type_namespace->_M_len] == '.') {
        uVar2 = type_namespace->_M_len + 1;
        __n1_00 = match->_M_len - uVar2;
        if (match->_M_len < uVar2) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr")
          ;
        }
        __str_00._M_str = match->_M_str + uVar2;
        __str_00._M_len = __n1_00;
        iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          (type_name,0,__n1_00,__str_00);
        goto LAB_0016913e;
      }
    }
    bVar3 = false;
  }
  else {
    __str_01._M_str = match->_M_str;
    __str_01._M_len = uVar2;
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (type_namespace,0,uVar2,__str_01);
LAB_0016913e:
    bVar3 = iVar1 == 0;
  }
  return bVar3;
}

Assistant:

static bool match(std::string_view const& type_namespace, std::string_view const& type_name, std::string_view const& match) noexcept
        {
            if (match.size() <= type_namespace.size())
            {
                return impl::starts_with(type_namespace, match);
            }

            if (!impl::starts_with(match, type_namespace))
            {
                return false;
            }

            if (match[type_namespace.size()] != '.')
            {
                return false;
            }

            return impl::starts_with(type_name, match.substr(type_namespace.size() + 1));
        }